

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O1

void __thiscall
luna::RuntimeException::RuntimeException(RuntimeException *this,char *module,int line,char *desc)

{
  char local_2e [2];
  int local_2c;
  char *local_28;
  char *local_20;
  
  (this->super_Exception).what_._M_dataplus._M_p = (pointer)&(this->super_Exception).what_.field_2;
  (this->super_Exception).what_._M_string_length = 0;
  (this->super_Exception).what_.field_2._M_local_buf[0] = '\0';
  local_2e[1] = 0x3a;
  local_2e[0] = ' ';
  local_2c = line;
  local_28 = desc;
  local_20 = module;
  Exception::SetWhat<char_const*&,char,int&,char,char_const*&>
            (&this->super_Exception,&local_20,local_2e + 1,&local_2c,local_2e,&local_28);
  return;
}

Assistant:

RuntimeException(const char *module, int line, const char *desc)
        {
            SetWhat(module, ':', line, ' ', desc);
        }